

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

dgMatrix * __thiscall
dgMeshEffect::CalculateOOBB(dgMatrix *__return_storage_ptr__,dgMeshEffect *this,dgBigVector *size)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  dgMatrix *pdVar6;
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  dgVector dVar11;
  dgTemplateVector<float> local_128;
  double local_118;
  double dStack_110;
  double dStack_108;
  double dStack_100;
  dgTemplateVector<float> local_f8;
  dgTemplateVector<float> local_e8;
  dgVector local_d8;
  dgSphere sphere;
  dgMatrix permuation;
  undefined1 auVar8 [56];
  undefined1 auVar10 [56];
  
  dgPolyhedra::CalculateSphere
            (&sphere,&this->super_dgPolyhedra,(HaF64 *)this->m_points,0x20,(dgMatrix *)0x0);
  dgBigVector::dgBigVector((dgBigVector *)&permuation,&sphere.m_size);
  (size->super_dgTemplateVector<double>).m_x =
       (double)permuation.m_front.super_dgTemplateVector<float>._0_8_;
  (size->super_dgTemplateVector<double>).m_y =
       (double)permuation.m_front.super_dgTemplateVector<float>._8_8_;
  (size->super_dgTemplateVector<double>).m_z =
       (double)CONCAT44(permuation.m_up.super_dgTemplateVector<float>.m_y,
                        permuation.m_up.super_dgTemplateVector<float>.m_x);
  (size->super_dgTemplateVector<double>).m_w =
       (double)CONCAT44(permuation.m_up.super_dgTemplateVector<float>.m_w,
                        permuation.m_up.super_dgTemplateVector<float>.m_z);
  pdVar6 = dgGetIdentityMatrix();
  permuation.m_front.super_dgTemplateVector<float>.m_z =
       (pdVar6->m_front).super_dgTemplateVector<float>.m_z;
  permuation.m_front.super_dgTemplateVector<float>.m_w =
       (pdVar6->m_front).super_dgTemplateVector<float>.m_w;
  uVar2 = (pdVar6->m_up).super_dgTemplateVector<float>.m_x;
  uVar3 = (pdVar6->m_up).super_dgTemplateVector<float>.m_w;
  uVar4 = (pdVar6->m_right).super_dgTemplateVector<float>.m_y;
  uVar5._0_4_ = (pdVar6->m_right).super_dgTemplateVector<float>.m_z;
  uVar5._4_4_ = (pdVar6->m_right).super_dgTemplateVector<float>.m_w;
  permuation.m_posit.super_dgTemplateVector<float>.m_x =
       (pdVar6->m_posit).super_dgTemplateVector<float>.m_x;
  permuation.m_posit.super_dgTemplateVector<float>.m_y =
       (pdVar6->m_posit).super_dgTemplateVector<float>.m_y;
  permuation.m_posit.super_dgTemplateVector<float>.m_z =
       (pdVar6->m_posit).super_dgTemplateVector<float>.m_z;
  permuation.m_posit.super_dgTemplateVector<float>.m_w =
       (pdVar6->m_posit).super_dgTemplateVector<float>.m_w;
  permuation.m_front.super_dgTemplateVector<float>.m_x = 0.0;
  permuation.m_front.super_dgTemplateVector<float>.m_y = 1.0;
  permuation.m_up.super_dgTemplateVector<float>.m_y = 0.0;
  permuation.m_up.super_dgTemplateVector<float>.m_z = 1.0;
  permuation.m_right.super_dgTemplateVector<float>._8_8_ = uVar5 & 0xffffffff00000000;
  permuation.m_right.super_dgTemplateVector<float>.m_y = (float)uVar4;
  permuation.m_right.super_dgTemplateVector<float>.m_x = 1.0;
  permuation.m_up.super_dgTemplateVector<float>.m_x = (float)uVar2;
  permuation.m_up.super_dgTemplateVector<float>.m_w = (float)uVar3;
  while ((dVar1 = (size->super_dgTemplateVector<double>).m_x,
         dVar1 < (size->super_dgTemplateVector<double>).m_y ||
         (dVar1 < (size->super_dgTemplateVector<double>).m_z))) {
    dgMatrix::operator*((dgMatrix *)&local_118,&permuation,&sphere.super_dgMatrix);
    auVar8 = ZEXT856((ulong)dStack_110);
    sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_ = local_118;
    sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_ = dStack_110;
    sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_ = dStack_108;
    sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_ = dStack_100;
    auVar10 = ZEXT856((ulong)local_e8._8_8_);
    sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x = local_f8.m_x;
    sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y = local_f8.m_y;
    sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z = local_f8.m_z;
    sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w = local_f8.m_w;
    sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x = local_e8.m_x;
    sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y = local_e8.m_y;
    sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z = local_e8.m_z;
    sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w = local_e8.m_w;
    dgVector::dgVector(&local_d8,size);
    dVar11 = dgMatrix::UnrotateVector(&permuation,&local_d8);
    auVar9._0_8_ = dVar11.super_dgTemplateVector<float>._8_8_;
    auVar9._8_56_ = auVar10;
    auVar7._0_8_ = dVar11.super_dgTemplateVector<float>._0_8_;
    auVar7._8_56_ = auVar8;
    local_128 = (dgTemplateVector<float>)vmovlhps_avx(auVar7._0_16_,auVar9._0_16_);
    dgBigVector::dgBigVector((dgBigVector *)&local_118,(dgVector *)&local_128);
    (size->super_dgTemplateVector<double>).m_x = local_118;
    (size->super_dgTemplateVector<double>).m_y = dStack_110;
    (size->super_dgTemplateVector<double>).m_z = dStack_108;
    (size->super_dgTemplateVector<double>).m_w = dStack_100;
  }
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x =
       sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_x;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y =
       sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_y;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z =
       sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_z;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w =
       sphere.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_w;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x =
       sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_x;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y =
       sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_y;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z =
       sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_z;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w =
       sphere.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_w;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x =
       sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y =
       sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z =
       sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w =
       sphere.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_x =
       sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_y =
       sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_z =
       sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w =
       sphere.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w;
  return __return_storage_ptr__;
}

Assistant:

dgMatrix dgMeshEffect::CalculateOOBB (dgBigVector& size) const
{
	dgSphere sphere (CalculateSphere (&m_points[0].m_x, sizeof (dgBigVector), NULL));
	size = sphere.m_size;

	dgMatrix permuation (dgGetIdentityMatrix());
	permuation[0][0] = hacd::HaF32 (0.0f);
	permuation[0][1] = hacd::HaF32 (1.0f);
	permuation[1][1] = hacd::HaF32 (0.0f);
	permuation[1][2] = hacd::HaF32 (1.0f);
	permuation[2][2] = hacd::HaF32 (0.0f);
	permuation[2][0] = hacd::HaF32 (1.0f);

	while ((size.m_x < size.m_y) || (size.m_x < size.m_z)) {
		sphere = permuation * sphere;
		size = permuation.UnrotateVector(size);
	}

	return sphere;
}